

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O0

filepos_t __thiscall
libmatroska::KaxInternalBlock::ReadData
          (KaxInternalBlock *this,IOCallback *input,ScopeMode ReadFully)

{
  LacingType LVar1;
  int32 iVar2;
  byte bVar3;
  bool bVar4;
  uint16 uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  EndOfStreamX *pEVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_t sVar10;
  DataBuffer *pDVar11;
  size_t sVar12;
  reference pvVar13;
  uint64 uVar14;
  int64 iVar15;
  uint *puVar16;
  uint32 *puVar17;
  undefined4 extraout_var_03;
  ulong uVar18;
  binary *pbVar19;
  reference ppDVar20;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ulong uVar21;
  undefined4 extraout_var_06;
  short *psVar22;
  byte *pbVar23;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  ulong local_2a0;
  EndOfStreamX *anon_var_0;
  uint64 SizeUnknown_1;
  uint32 SizeRead_1;
  int32 FrameSize_1;
  undefined1 auStack_108 [2];
  uint8 Index_2;
  uint8 FrameNum_1;
  uint32 LastBufferSize_1;
  size_t sStack_100;
  Endian<short,_(libebml::endianess)0> local_f6;
  byte local_f1;
  big_int16 b16;
  binary *pbStack_f0;
  uint8 BlockHeadSize_1;
  binary *_tmpBuf;
  binary *cursor;
  ulong uStack_d8;
  binary _TempHead [5];
  binary *ExpectedEnd;
  binary *FrameEnd;
  binary *FrameStart;
  size_t Index_1;
  size_t NumFrames;
  binary *BufferEnd;
  DataBuffer *lacedFrame;
  uint8 Value;
  uint64 SizeUnknown;
  uint32 SizeRead;
  int32 FrameSize;
  uint8 Index;
  uint8 FrameNum;
  DataBuffer *pDStack_80;
  uint32 LastBufferSize;
  DataBuffer *soloFrame;
  size_t sStack_70;
  byte local_62;
  byte local_61;
  undefined1 local_60 [6];
  uint8 Flags;
  uint8 BlockHeadSize;
  SafeReadIOCallback Mem;
  binary *BufferStart;
  filepos_t local_30;
  filepos_t Result;
  ScopeMode ReadFully_local;
  IOCallback *input_local;
  KaxInternalBlock *this_local;
  
  iVar6 = (*input->_vptr_IOCallback[5])();
  this->FirstFrameLocation = CONCAT44(extraout_var,iVar6);
  libebml::EbmlElement::SetValueIsSet((EbmlElement *)this,false);
  if (ReadFully == SCOPE_ALL_DATA) {
    local_30 = libebml::EbmlBinary::ReadData(&this->super_EbmlBinary,input,SCOPE_ALL_DATA);
    iVar6 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])();
    if (local_30 != CONCAT44(extraout_var_00,iVar6)) {
      pEVar9 = (EndOfStreamX *)__cxa_allocate_exception(8);
      iVar6 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])();
      libebml::SafeReadIOCallback::EndOfStreamX::EndOfStreamX
                (pEVar9,CONCAT44(extraout_var_01,iVar6) - local_30);
      __cxa_throw(pEVar9,&libebml::SafeReadIOCallback::EndOfStreamX::typeinfo,0);
    }
    Mem.mSize = (size_t)libebml::EbmlBinary::GetBuffer(&this->super_EbmlBinary);
    libebml::SafeReadIOCallback::SafeReadIOCallback
              ((SafeReadIOCallback *)local_60,&this->super_EbmlBinary);
    local_61 = 4;
    bVar3 = libebml::SafeReadIOCallback::GetUInt8((SafeReadIOCallback *)local_60);
    this->TrackNumber = (ushort)bVar3;
    if ((this->TrackNumber & 0x80) == 0) {
      if ((this->TrackNumber & 0x40) == 0) {
        pEVar9 = (EndOfStreamX *)__cxa_allocate_exception(8);
        libebml::SafeReadIOCallback::EndOfStreamX::EndOfStreamX(pEVar9,0);
        __cxa_throw(pEVar9,&libebml::SafeReadIOCallback::EndOfStreamX::typeinfo,0);
      }
      this->TrackNumber = (this->TrackNumber & 0x3f) << 8;
      bVar3 = libebml::SafeReadIOCallback::GetUInt8((SafeReadIOCallback *)local_60);
      this->TrackNumber = this->TrackNumber + (ushort)bVar3;
      local_61 = local_61 + 1;
    }
    else {
      this->TrackNumber = this->TrackNumber & 0x7f;
    }
    uVar5 = libebml::SafeReadIOCallback::GetUInt16BE((SafeReadIOCallback *)local_60);
    this->LocalTimecode = uVar5;
    this->bLocalTimecodeUsed = true;
    local_62 = libebml::SafeReadIOCallback::GetUInt8((SafeReadIOCallback *)local_60);
    iVar6 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[3])();
    soloFrame = *(DataBuffer **)CONCAT44(extraout_var_02,iVar6);
    sStack_70 = ((undefined8 *)CONCAT44(extraout_var_02,iVar6))[1];
    bVar4 = libebml::EbmlId::operator==
                      ((EbmlId *)&soloFrame,(EbmlId *)KaxSimpleBlock::ClassInfos._8_8_);
    if (bVar4) {
      this->bIsKeyframe = (local_62 & 0x80) != 0;
      this->bIsDiscardable = (local_62 & 1) != 0;
    }
    this->mInvisible = (int)(local_62 & 8) >> 3 != 0;
    this->mLacing = (int)(local_62 & 6) >> 1;
    if (this->mLacing == LACING_NONE) {
      sVar10 = libebml::SafeReadIOCallback::GetPosition((SafeReadIOCallback *)local_60);
      this->FirstFrameLocation = this->FirstFrameLocation + sVar10;
      pDVar11 = (DataBuffer *)operator_new(0x28);
      sVar10 = Mem.mSize;
      sVar12 = libebml::SafeReadIOCallback::GetPosition((SafeReadIOCallback *)local_60);
      iVar6 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])();
      DataBuffer::DataBuffer
                (pDVar11,(binary *)(sVar10 + sVar12),iVar6 - (uint)local_61,
                 (_func_bool_DataBuffer_ptr *)0x0,false);
      pDStack_80 = pDVar11;
      std::vector<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>::push_back
                (&this->myBuffers,&stack0xffffffffffffff80);
      std::vector<int,_std::allocator<int>_>::resize(&this->SizeList,1);
      iVar6 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])();
      uVar7 = (uint)local_61;
      pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](&this->SizeList,0);
      *pvVar13 = iVar6 - uVar7;
    }
    else {
      iVar6 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])();
      FrameSize = ~(uint)local_61 + iVar6;
      SizeRead._3_1_ = libebml::SafeReadIOCallback::GetUInt8((SafeReadIOCallback *)local_60);
      std::vector<int,_std::allocator<int>_>::resize(&this->SizeList,(ulong)(SizeRead._3_1_ + 1));
      sVar10 = Mem.mSize;
      LVar1 = this->mLacing;
      if (LVar1 == LACING_XIPH) {
        for (SizeRead._2_1_ = 0; iVar2 = FrameSize, SizeRead._2_1_ < SizeRead._3_1_;
            SizeRead._2_1_ = SizeRead._2_1_ + 1) {
          SizeUnknown._4_4_ = 0;
          do {
            lacedFrame._7_1_ = libebml::SafeReadIOCallback::GetUInt8((SafeReadIOCallback *)local_60)
            ;
            iVar6 = (uint)lacedFrame._7_1_ + SizeUnknown._4_4_;
            FrameSize = FrameSize + -1;
            SizeUnknown._4_4_ = iVar6;
          } while (lacedFrame._7_1_ == 0xff);
          pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&this->SizeList,(ulong)SizeRead._2_1_);
          *pvVar13 = iVar6;
          FrameSize = FrameSize - SizeUnknown._4_4_;
        }
        pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                            (&this->SizeList,(ulong)SizeRead._2_1_);
        *pvVar13 = iVar2;
      }
      else if (LVar1 == LACING_FIXED) {
        for (SizeRead._2_1_ = 0; SizeRead._2_1_ <= SizeRead._3_1_;
            SizeRead._2_1_ = SizeRead._2_1_ + 1) {
          uVar7 = (uint)FrameSize / (SizeRead._3_1_ + 1);
          puVar16 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                      (&this->SizeList,(ulong)SizeRead._2_1_);
          *puVar16 = uVar7;
        }
      }
      else {
        if (LVar1 != LACING_EBML) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                        ,0x22e,
                        "virtual filepos_t libmatroska::KaxInternalBlock::ReadData(IOCallback &, ScopeMode)"
                       );
        }
        SizeUnknown._0_4_ = FrameSize;
        sVar12 = libebml::SafeReadIOCallback::GetPosition((SafeReadIOCallback *)local_60);
        uVar14 = libebml::ReadCodedSizeValue
                           ((binary *)(sVar10 + sVar12),(uint32 *)&SizeUnknown,
                            (uint64 *)&stack0xffffffffffffff68);
        iVar6 = (int)uVar14;
        SizeUnknown._4_4_ = iVar6;
        if ((iVar6 == 0) || ((uint)FrameSize < iVar6 + (uint)SizeUnknown)) {
          pEVar9 = (EndOfStreamX *)__cxa_allocate_exception(8);
          libebml::SafeReadIOCallback::EndOfStreamX::EndOfStreamX(pEVar9,(ulong)(uint)SizeUnknown);
          __cxa_throw(pEVar9,&libebml::SafeReadIOCallback::EndOfStreamX::typeinfo,0);
        }
        pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](&this->SizeList,0);
        *pvVar13 = iVar6;
        libebml::SafeReadIOCallback::Skip((SafeReadIOCallback *)local_60,(ulong)(uint)SizeUnknown);
        FrameSize = FrameSize - (SizeUnknown._4_4_ + (uint)SizeUnknown);
        for (SizeRead._2_1_ = 1; sVar10 = Mem.mSize, iVar2 = FrameSize,
            SizeRead._2_1_ < SizeRead._3_1_; SizeRead._2_1_ = SizeRead._2_1_ + 1) {
          SizeUnknown._0_4_ = FrameSize;
          sVar12 = libebml::SafeReadIOCallback::GetPosition((SafeReadIOCallback *)local_60);
          iVar15 = libebml::ReadCodedSizeSignedValue
                             ((binary *)(sVar10 + sVar12),(uint32 *)&SizeUnknown,
                              (uint64 *)&stack0xffffffffffffff68);
          iVar6 = SizeUnknown._4_4_ + (int)iVar15;
          SizeUnknown._4_4_ = iVar6;
          if ((iVar6 == 0) || ((uint)FrameSize < iVar6 + (uint)SizeUnknown)) {
            pEVar9 = (EndOfStreamX *)__cxa_allocate_exception(8);
            libebml::SafeReadIOCallback::EndOfStreamX::EndOfStreamX(pEVar9,(ulong)(uint)SizeUnknown)
            ;
            __cxa_throw(pEVar9,&libebml::SafeReadIOCallback::EndOfStreamX::typeinfo,0);
          }
          pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&this->SizeList,(ulong)SizeRead._2_1_);
          *pvVar13 = iVar6;
          libebml::SafeReadIOCallback::Skip((SafeReadIOCallback *)local_60,(ulong)(uint)SizeUnknown)
          ;
          FrameSize = FrameSize - (SizeUnknown._4_4_ + (uint)SizeUnknown);
        }
        if (SizeRead._2_1_ <= SizeRead._3_1_) {
          pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&this->SizeList,(ulong)SizeRead._2_1_);
          *pvVar13 = iVar2;
        }
      }
      sVar10 = libebml::SafeReadIOCallback::GetPosition((SafeReadIOCallback *)local_60);
      this->FirstFrameLocation = sVar10 + this->FirstFrameLocation;
      for (SizeRead._2_1_ = 0; SizeRead._2_1_ <= SizeRead._3_1_; SizeRead._2_1_ = SizeRead._2_1_ + 1
          ) {
        pDVar11 = (DataBuffer *)operator_new(0x28);
        sVar10 = Mem.mSize;
        sVar12 = libebml::SafeReadIOCallback::GetPosition((SafeReadIOCallback *)local_60);
        puVar17 = (uint32 *)
                  std::vector<int,_std::allocator<int>_>::operator[]
                            (&this->SizeList,(ulong)SizeRead._2_1_);
        DataBuffer::DataBuffer
                  (pDVar11,(binary *)(sVar10 + sVar12),*puVar17,(_func_bool_DataBuffer_ptr *)0x0,
                   false);
        BufferEnd = (binary *)pDVar11;
        std::vector<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>::
        push_back(&this->myBuffers,(value_type *)&BufferEnd);
        pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                            (&this->SizeList,(ulong)SizeRead._2_1_);
        libebml::SafeReadIOCallback::Skip((SafeReadIOCallback *)local_60,(long)*pvVar13);
      }
    }
    sVar10 = Mem.mSize;
    iVar6 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])();
    uVar18 = sVar10 + CONCAT44(extraout_var_03,iVar6);
    pbVar19 = (binary *)
              std::vector<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>::
              size(&this->myBuffers);
    for (FrameStart = (binary *)0x0; FrameStart < pbVar19; FrameStart = FrameStart + 1) {
      ppDVar20 = std::vector<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                 ::operator[](&this->myBuffers,(size_type)FrameStart);
      iVar6 = (*(*ppDVar20)->_vptr_DataBuffer[2])();
      ppDVar20 = std::vector<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                 ::operator[](&this->myBuffers,(size_type)FrameStart);
      iVar8 = (*(*ppDVar20)->_vptr_DataBuffer[3])();
      uVar21 = CONCAT44(extraout_var_04,iVar6) + (ulong)*(uint *)CONCAT44(extraout_var_05,iVar8);
      local_2a0 = uVar18;
      if (FrameStart + 1 < pbVar19) {
        ppDVar20 = std::
                   vector<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>::
                   operator[](&this->myBuffers,(size_type)(FrameStart + 1));
        iVar8 = (*(*ppDVar20)->_vptr_DataBuffer[2])();
        local_2a0 = CONCAT44(extraout_var_06,iVar8);
      }
      uStack_d8 = local_2a0;
      if (((CONCAT44(extraout_var_04,iVar6) < Mem.mSize) || (uVar18 < uVar21)) ||
         (uVar21 != local_2a0)) {
        pEVar9 = (EndOfStreamX *)__cxa_allocate_exception(8);
        libebml::SafeReadIOCallback::EndOfStreamX::EndOfStreamX(pEVar9,0);
        __cxa_throw(pEVar9,&libebml::SafeReadIOCallback::EndOfStreamX::typeinfo,0);
      }
    }
    libebml::EbmlElement::SetValueIsSet((EbmlElement *)this,true);
    libebml::SafeReadIOCallback::~SafeReadIOCallback((SafeReadIOCallback *)local_60);
  }
  else if (ReadFully == SCOPE_PARTIAL_DATA) {
    iVar6 = (*input->_vptr_IOCallback[2])(input,(long)&cursor + 3,5);
    if (iVar6 != 5) {
      pEVar9 = (EndOfStreamX *)__cxa_allocate_exception(8);
      libebml::SafeReadIOCallback::EndOfStreamX::EndOfStreamX(pEVar9,0);
      __cxa_throw(pEVar9,&libebml::SafeReadIOCallback::EndOfStreamX::typeinfo,0);
    }
    local_f1 = 4;
    _tmpBuf = (binary *)((long)&cursor + 4);
    this->TrackNumber = (ushort)cursor._3_1_;
    if ((this->TrackNumber & 0x80) == 0) {
      if ((this->TrackNumber & 0x40) == 0) {
        return 5;
      }
      this->TrackNumber = (this->TrackNumber & 0x3f) << 8;
      _tmpBuf = (binary *)((long)&cursor + 5);
      this->TrackNumber = this->TrackNumber + (ushort)cursor._4_1_;
      local_f1 = 5;
    }
    else {
      this->TrackNumber = this->TrackNumber & 0x7f;
    }
    libebml::Endian<short,_(libebml::endianess)0>::Endian(&local_f6);
    libebml::Endian<short,_(libebml::endianess)0>::Eval(&local_f6,_tmpBuf);
    psVar22 = libebml::Endian::operator_cast_to_short_((Endian *)&local_f6);
    this->LocalTimecode = *psVar22;
    this->bLocalTimecodeUsed = true;
    pbVar23 = _tmpBuf + 2;
    iVar6 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[3])();
    _auStack_108 = *(undefined8 *)CONCAT44(extraout_var_07,iVar6);
    sStack_100 = ((undefined8 *)CONCAT44(extraout_var_07,iVar6))[1];
    bVar4 = libebml::EbmlId::operator==
                      ((EbmlId *)auStack_108,(EbmlId *)KaxSimpleBlock::ClassInfos._8_8_);
    if (bVar4) {
      this->bIsKeyframe = (*pbVar23 & 0x80) != 0;
      this->bIsDiscardable = (*pbVar23 & 1) != 0;
    }
    this->mInvisible = (int)(*pbVar23 & 8) >> 3 != 0;
    this->mLacing = (int)(*pbVar23 & 6) >> 1;
    if (_tmpBuf + 3 == (binary *)((long)&cursor + 7)) {
      cursor._3_1_ = cursor._7_1_;
    }
    else {
      (*input->_vptr_IOCallback[2])(input,(long)&cursor + 3,1);
    }
    this->FirstFrameLocation =
         (uint64)(_tmpBuf + 3 + (this->FirstFrameLocation - ((long)&cursor + 3)));
    if (this->mLacing == LACING_NONE) {
      std::vector<int,_std::allocator<int>_>::resize(&this->SizeList,1);
      iVar6 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])();
      uVar7 = (uint)local_f1;
      pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](&this->SizeList,0);
      *pvVar13 = iVar6 - uVar7;
    }
    else {
      iVar6 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])();
      FrameSize_1 = ~(uint)local_f1 + iVar6;
      SizeRead_1._3_1_ = cursor._3_1_;
      std::vector<int,_std::allocator<int>_>::resize(&this->SizeList,(ulong)(cursor._3_1_ + 1));
      LVar1 = this->mLacing;
      if (LVar1 == LACING_XIPH) {
        for (SizeRead_1._2_1_ = 0; iVar2 = FrameSize_1, SizeRead_1._2_1_ < SizeRead_1._3_1_;
            SizeRead_1._2_1_ = SizeRead_1._2_1_ + 1) {
          SizeUnknown_1._4_4_ = 0;
          do {
            (*input->_vptr_IOCallback[2])(input,(long)&cursor + 3,1);
            iVar6 = (uint)cursor._3_1_ + SizeUnknown_1._4_4_;
            FrameSize_1 = FrameSize_1 + -1;
            this->FirstFrameLocation = this->FirstFrameLocation + 1;
            SizeUnknown_1._4_4_ = iVar6;
          } while (cursor._3_1_ == 0xff);
          this->FirstFrameLocation = this->FirstFrameLocation + 1;
          pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&this->SizeList,(ulong)SizeRead_1._2_1_);
          *pvVar13 = iVar6;
          FrameSize_1 = FrameSize_1 - SizeUnknown_1._4_4_;
        }
        pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                            (&this->SizeList,(ulong)SizeRead_1._2_1_);
        *pvVar13 = iVar2;
      }
      else if (LVar1 == LACING_FIXED) {
        for (SizeRead_1._2_1_ = 0; SizeRead_1._2_1_ <= SizeRead_1._3_1_;
            SizeRead_1._2_1_ = SizeRead_1._2_1_ + 1) {
          uVar7 = (uint)FrameSize_1 / (SizeRead_1._3_1_ + 1);
          puVar16 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                      (&this->SizeList,(ulong)SizeRead_1._2_1_);
          *puVar16 = uVar7;
        }
      }
      else {
        if (LVar1 != LACING_EBML) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                        ,0x2b2,
                        "virtual filepos_t libmatroska::KaxInternalBlock::ReadData(IOCallback &, ScopeMode)"
                       );
        }
        SizeUnknown_1._0_4_ = FrameSize_1;
        pbVar19 = (binary *)operator_new__((ulong)SizeRead_1._3_1_ << 2);
        pbStack_f0 = pbVar19;
        (*input->_vptr_IOCallback[2])(input,pbVar19,(ulong)SizeRead_1._3_1_ << 2);
        uVar14 = libebml::ReadCodedSizeValue(pbVar19,(uint32 *)&SizeUnknown_1,(uint64 *)&anon_var_0)
        ;
        SizeUnknown_1._4_4_ = (value_type)uVar14;
        pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](&this->SizeList,0);
        *pvVar13 = (value_type)uVar14;
        _tmpBuf = pbVar19 + (uint)SizeUnknown_1;
        FrameSize_1 = FrameSize_1 - (SizeUnknown_1._4_4_ + (uint)SizeUnknown_1);
        for (SizeRead_1._2_1_ = 1; iVar2 = FrameSize_1, SizeRead_1._2_1_ < SizeRead_1._3_1_;
            SizeRead_1._2_1_ = SizeRead_1._2_1_ + 1) {
          SizeUnknown_1._0_4_ = FrameSize_1;
          iVar15 = libebml::ReadCodedSizeSignedValue
                             (_tmpBuf,(uint32 *)&SizeUnknown_1,(uint64 *)&anon_var_0);
          iVar6 = SizeUnknown_1._4_4_ + (int)iVar15;
          SizeUnknown_1._4_4_ = iVar6;
          pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&this->SizeList,(ulong)SizeRead_1._2_1_);
          *pvVar13 = iVar6;
          _tmpBuf = _tmpBuf + (uint)SizeUnknown_1;
          FrameSize_1 = FrameSize_1 - (SizeUnknown_1._4_4_ + (uint)SizeUnknown_1);
        }
        this->FirstFrameLocation = (uint64)(_tmpBuf + (this->FirstFrameLocation - (long)pbStack_f0))
        ;
        pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                            (&this->SizeList,(ulong)SizeRead_1._2_1_);
        *pvVar13 = iVar2;
        if (pbStack_f0 != (binary *)0x0) {
          operator_delete__(pbStack_f0);
        }
      }
    }
    libebml::EbmlElement::SetValueIsSet((EbmlElement *)this,false);
    iVar6 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])();
    local_30 = CONCAT44(extraout_var_08,iVar6);
  }
  else {
    libebml::EbmlElement::SetValueIsSet((EbmlElement *)this,false);
    iVar6 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])();
    local_30 = CONCAT44(extraout_var_09,iVar6);
  }
  return local_30;
}

Assistant:

filepos_t KaxInternalBlock::ReadData(IOCallback & input, ScopeMode ReadFully)
{
  filepos_t Result;

  FirstFrameLocation = input.getFilePointer(); // will be updated accordingly below

  SetValueIsSet(false);

  try {
    if (ReadFully == SCOPE_ALL_DATA) {
      Result = EbmlBinary::ReadData(input, ReadFully);
      if (Result != GetSize())
        throw SafeReadIOCallback::EndOfStreamX(GetSize() - Result);

      binary *BufferStart = EbmlBinary::GetBuffer();

      SafeReadIOCallback Mem(*this);
      uint8 BlockHeadSize = 4;

      // update internal values
      TrackNumber = Mem.GetUInt8();
      if ((TrackNumber & 0x80) == 0) {
        // there is extra data
        if ((TrackNumber & 0x40) == 0) {
          // We don't support track numbers that large !
          throw SafeReadIOCallback::EndOfStreamX(0);
        }
        TrackNumber = (TrackNumber & 0x3F) << 8;
        TrackNumber += Mem.GetUInt8();
        BlockHeadSize++;
      } else {
        TrackNumber &= 0x7F;
      }

      LocalTimecode = int16(Mem.GetUInt16BE());
      bLocalTimecodeUsed = true;

      uint8 Flags = Mem.GetUInt8();
      if (EbmlId(*this) == EBML_ID(KaxSimpleBlock)) {
        bIsKeyframe = (Flags & 0x80) != 0;
        bIsDiscardable = (Flags & 0x01) != 0;
      }
      mInvisible = (Flags & 0x08) >> 3;
      mLacing = LacingType((Flags & 0x06) >> 1);

      // put all Frames in the list
      if (mLacing == LACING_NONE) {
        FirstFrameLocation += Mem.GetPosition();
        DataBuffer * soloFrame = new DataBuffer(BufferStart + Mem.GetPosition(), GetSize() - BlockHeadSize);
        myBuffers.push_back(soloFrame);
        SizeList.resize(1);
        SizeList[0] = GetSize() - BlockHeadSize;
      } else {
        // read the number of frames in the lace
        uint32 LastBufferSize = GetSize() - BlockHeadSize - 1; // 1 for number of frame
        uint8 FrameNum = Mem.GetUInt8(); // number of frames in the lace - 1
        // read the list of frame sizes
        uint8 Index;
        int32 FrameSize;
        uint32 SizeRead;
        uint64 SizeUnknown;

        SizeList.resize(FrameNum + 1);

        switch (mLacing) {
          case LACING_XIPH:
            for (Index=0; Index<FrameNum; Index++) {
              // get the size of the frame
              FrameSize = 0;
              uint8 Value;
              do {
                Value = Mem.GetUInt8();
                FrameSize += Value;
                LastBufferSize--;
              } while (Value == 0xFF);
              SizeList[Index] = FrameSize;
              LastBufferSize -= FrameSize;
            }
            SizeList[Index] = LastBufferSize;
            break;
          case LACING_EBML:
            SizeRead = LastBufferSize;
            FrameSize = ReadCodedSizeValue(BufferStart + Mem.GetPosition(), SizeRead, SizeUnknown);
            if (!FrameSize || (static_cast<uint32>(FrameSize + SizeRead) > LastBufferSize))
              throw SafeReadIOCallback::EndOfStreamX(SizeRead);
            SizeList[0] = FrameSize;
            Mem.Skip(SizeRead);
            LastBufferSize -= FrameSize + SizeRead;

            for (Index=1; Index<FrameNum; Index++) {
              // get the size of the frame
              SizeRead = LastBufferSize;
              FrameSize += ReadCodedSizeSignedValue(BufferStart + Mem.GetPosition(), SizeRead, SizeUnknown);
              if (!FrameSize || (static_cast<uint32>(FrameSize + SizeRead) > LastBufferSize))
                throw SafeReadIOCallback::EndOfStreamX(SizeRead);
              SizeList[Index] = FrameSize;
              Mem.Skip(SizeRead);
              LastBufferSize -= FrameSize + SizeRead;
            }
            if (Index <= FrameNum) // Safety check if FrameNum == 0
              SizeList[Index] = LastBufferSize;
            break;
          case LACING_FIXED:
            for (Index=0; Index<=FrameNum; Index++) {
              // get the size of the frame
              SizeList[Index] = LastBufferSize / (FrameNum + 1);
            }
            break;
          default: // other lacing not supported
            assert(0);
        }

        FirstFrameLocation += Mem.GetPosition();

        for (Index=0; Index<=FrameNum; Index++) {
          DataBuffer * lacedFrame = new DataBuffer(BufferStart + Mem.GetPosition(), SizeList[Index]);
          myBuffers.push_back(lacedFrame);
          Mem.Skip(SizeList[Index]);
        }
      }

      binary *BufferEnd = BufferStart + GetSize();
      size_t NumFrames  = myBuffers.size();

      // Sanity checks for frame pointers and boundaries.
      for (size_t Index = 0; Index < NumFrames; ++Index) {
        binary *FrameStart  = myBuffers[Index]->Buffer();
        binary *FrameEnd    = FrameStart + myBuffers[Index]->Size();
        binary *ExpectedEnd = (Index + 1) < NumFrames ? myBuffers[Index + 1]->Buffer() : BufferEnd;

        if ((FrameStart < BufferStart) || (FrameEnd > BufferEnd) || (FrameEnd != ExpectedEnd))
          throw SafeReadIOCallback::EndOfStreamX(0);
      }

      SetValueIsSet();
    } else if (ReadFully == SCOPE_PARTIAL_DATA) {
      binary _TempHead[5];
      Result = input.read(_TempHead, 5);
      if (Result != 5)
        throw SafeReadIOCallback::EndOfStreamX(0);
      binary *cursor = _TempHead;
      binary *_tmpBuf;
      uint8 BlockHeadSize = 4;

      // update internal values
      TrackNumber = *cursor++;
      if ((TrackNumber & 0x80) == 0) {
        // there is extra data
        if ((TrackNumber & 0x40) == 0) {
          // We don't support track numbers that large !
          return Result;
        }
        TrackNumber = (TrackNumber & 0x3F) << 8;
        TrackNumber += *cursor++;
        BlockHeadSize++;
      } else {
        TrackNumber &= 0x7F;
      }

      big_int16 b16;
      b16.Eval(cursor);
      LocalTimecode = int16(b16);
      bLocalTimecodeUsed = true;
      cursor += 2;

      if (EbmlId(*this) == EBML_ID(KaxSimpleBlock)) {
        bIsKeyframe = (*cursor & 0x80) != 0;
        bIsDiscardable = (*cursor & 0x01) != 0;
      }
      mInvisible = (*cursor & 0x08) >> 3;
      mLacing = LacingType((*cursor++ & 0x06) >> 1);
      if (cursor == &_TempHead[4]) {
        _TempHead[0] = _TempHead[4];
      } else {
        Result += input.read(_TempHead, 1);
      }

      FirstFrameLocation += cursor - _TempHead;

      // put all Frames in the list
      if (mLacing != LACING_NONE) {
        // read the number of frames in the lace
        uint32 LastBufferSize = GetSize() - BlockHeadSize - 1; // 1 for number of frame
        uint8 FrameNum = _TempHead[0]; // number of frames in the lace - 1
        // read the list of frame sizes
        uint8 Index;
        int32 FrameSize;
        uint32 SizeRead;
        uint64 SizeUnknown;

        SizeList.resize(FrameNum + 1);

        switch (mLacing) {
          case LACING_XIPH:
            for (Index=0; Index<FrameNum; Index++) {
              // get the size of the frame
              FrameSize = 0;
              do {
                Result += input.read(_TempHead, 1);
                FrameSize += uint8(_TempHead[0]);
                LastBufferSize--;

                FirstFrameLocation++;
              } while (_TempHead[0] == 0xFF);

              FirstFrameLocation++;
              SizeList[Index] = FrameSize;
              LastBufferSize -= FrameSize;
            }
            SizeList[Index] = LastBufferSize;
            break;
          case LACING_EBML:
            SizeRead = LastBufferSize;
            cursor = _tmpBuf = new binary[FrameNum*4]; /// \warning assume the mean size will be coded in less than 4 bytes
            Result += input.read(cursor, FrameNum*4);
            FrameSize = ReadCodedSizeValue(cursor, SizeRead, SizeUnknown);
            SizeList[0] = FrameSize;
            cursor += SizeRead;
            LastBufferSize -= FrameSize + SizeRead;

            for (Index=1; Index<FrameNum; Index++) {
              // get the size of the frame
              SizeRead = LastBufferSize;
              FrameSize += ReadCodedSizeSignedValue(cursor, SizeRead, SizeUnknown);
              SizeList[Index] = FrameSize;
              cursor += SizeRead;
              LastBufferSize -= FrameSize + SizeRead;
            }

            FirstFrameLocation += cursor - _tmpBuf;

            SizeList[Index] = LastBufferSize;
            delete [] _tmpBuf;
            break;
          case LACING_FIXED:
            for (Index=0; Index<=FrameNum; Index++) {
              // get the size of the frame
              SizeList[Index] = LastBufferSize / (FrameNum + 1);
            }
            break;
          default: // other lacing not supported
            assert(0);
        }
      } else {
        SizeList.resize(1);
        SizeList[0] = GetSize() - BlockHeadSize;
      }
      SetValueIsSet(false);
      Result = GetSize();
    } else {
      SetValueIsSet(false);
      Result = GetSize();
    }

  } catch (SafeReadIOCallback::EndOfStreamX &) {
    SetValueIsSet(false);

    std::memset(EbmlBinary::GetBuffer(), 0, GetSize());
    myBuffers.clear();
    SizeList.clear();
    Timecode           = 0;
    LocalTimecode      = 0;
    TrackNumber        = 0;
    bLocalTimecodeUsed = false;
    FirstFrameLocation = 0;

    return 0;
  }

  return Result;
}